

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

void __thiscall CGameControllerCTF::Snap(CGameControllerCTF *this,int SnappingClient)

{
  bool bVar1;
  int iVar2;
  IServer *pIVar3;
  undefined4 extraout_var;
  CCharacter *pCVar5;
  CPlayer *pCVar6;
  IGameController *in_RDI;
  int in_stack_0000000c;
  CNetObj_GameDataFlag *pGameDataFlag;
  int *piVar4;
  
  IGameController::Snap((IGameController *)pGameDataFlag,in_stack_0000000c);
  pIVar3 = IGameController::Server(in_RDI);
  iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x10])(pIVar3,8,0,0x10);
  piVar4 = (int *)CONCAT44(extraout_var,iVar2);
  if (piVar4 == (int *)0x0) {
    return;
  }
  piVar4[2] = 0;
  if (in_RDI[1]._vptr_IGameController == (_func_int **)0x0) {
    *piVar4 = -3;
  }
  else {
    bVar1 = CFlag::IsAtStand((CFlag *)in_RDI[1]._vptr_IGameController);
    if (bVar1) {
      *piVar4 = -2;
    }
    else {
      pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1]._vptr_IGameController);
      if (pCVar5 != (CCharacter *)0x0) {
        pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1]._vptr_IGameController);
        pCVar6 = CCharacter::GetPlayer(pCVar5);
        if (pCVar6 != (CPlayer *)0x0) {
          pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1]._vptr_IGameController);
          pCVar6 = CCharacter::GetPlayer(pCVar5);
          iVar2 = CPlayer::GetCID(pCVar6);
          *piVar4 = iVar2;
          goto LAB_0012d345;
        }
      }
      *piVar4 = -1;
      iVar2 = CFlag::GetDropTick((CFlag *)in_RDI[1]._vptr_IGameController);
      piVar4[2] = iVar2;
    }
  }
LAB_0012d345:
  piVar4[3] = 0;
  if (in_RDI[1].m_pGameServer == (CGameContext *)0x0) {
    piVar4[1] = -3;
  }
  else {
    bVar1 = CFlag::IsAtStand((CFlag *)in_RDI[1].m_pGameServer);
    if (bVar1) {
      piVar4[1] = -2;
    }
    else {
      pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1].m_pGameServer);
      if (pCVar5 != (CCharacter *)0x0) {
        pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1].m_pGameServer);
        pCVar6 = CCharacter::GetPlayer(pCVar5);
        if (pCVar6 != (CPlayer *)0x0) {
          pCVar5 = CFlag::GetCarrier((CFlag *)in_RDI[1].m_pGameServer);
          pCVar6 = CCharacter::GetPlayer(pCVar5);
          iVar2 = CPlayer::GetCID(pCVar6);
          piVar4[1] = iVar2;
          return;
        }
      }
      piVar4[1] = -1;
      iVar2 = CFlag::GetDropTick((CFlag *)in_RDI[1].m_pGameServer);
      piVar4[3] = iVar2;
    }
  }
  return;
}

Assistant:

void CGameControllerCTF::Snap(int SnappingClient)
{
	IGameController::Snap(SnappingClient);

	CNetObj_GameDataFlag *pGameDataFlag = static_cast<CNetObj_GameDataFlag *>(Server()->SnapNewItem(NETOBJTYPE_GAMEDATAFLAG, 0, sizeof(CNetObj_GameDataFlag)));
	if(!pGameDataFlag)
		return;

	pGameDataFlag->m_FlagDropTickRed = 0;
	if(m_apFlags[TEAM_RED])
	{
		if(m_apFlags[TEAM_RED]->IsAtStand())
			pGameDataFlag->m_FlagCarrierRed = FLAG_ATSTAND;
		else if(m_apFlags[TEAM_RED]->GetCarrier() && m_apFlags[TEAM_RED]->GetCarrier()->GetPlayer())
			pGameDataFlag->m_FlagCarrierRed = m_apFlags[TEAM_RED]->GetCarrier()->GetPlayer()->GetCID();
		else
		{
			pGameDataFlag->m_FlagCarrierRed = FLAG_TAKEN;
			pGameDataFlag->m_FlagDropTickRed = m_apFlags[TEAM_RED]->GetDropTick();
		}
	}
	else
		pGameDataFlag->m_FlagCarrierRed = FLAG_MISSING;
	pGameDataFlag->m_FlagDropTickBlue = 0;
	if(m_apFlags[TEAM_BLUE])
	{
		if(m_apFlags[TEAM_BLUE]->IsAtStand())
			pGameDataFlag->m_FlagCarrierBlue = FLAG_ATSTAND;
		else if(m_apFlags[TEAM_BLUE]->GetCarrier() && m_apFlags[TEAM_BLUE]->GetCarrier()->GetPlayer())
			pGameDataFlag->m_FlagCarrierBlue = m_apFlags[TEAM_BLUE]->GetCarrier()->GetPlayer()->GetCID();
		else
		{
			pGameDataFlag->m_FlagCarrierBlue = FLAG_TAKEN;
			pGameDataFlag->m_FlagDropTickBlue = m_apFlags[TEAM_BLUE]->GetDropTick();
		}
	}
	else
		pGameDataFlag->m_FlagCarrierBlue = FLAG_MISSING;
}